

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int Wlc_BlastLessSigned(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits)

{
  int iCtrl;
  int iData0;
  int iVar1;
  
  iCtrl = Gia_ManHashXor(pNew,pArg0[(long)nBits + -1],pArg1[(long)nBits + -1]);
  iVar1 = pArg0[(long)nBits + -1];
  iData0 = Wlc_BlastLess(pNew,pArg0,pArg1,nBits + -1);
  iVar1 = Gia_ManHashMux(pNew,iCtrl,iVar1,iData0);
  return iVar1;
}

Assistant:

int Wlc_BlastLessSigned( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits )
{
    int iDiffSign = Gia_ManHashXor( pNew, pArg0[nBits-1], pArg1[nBits-1] );
    return Gia_ManHashMux( pNew, iDiffSign, pArg0[nBits-1], Wlc_BlastLess(pNew, pArg0, pArg1, nBits-1) );
}